

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_>
helics::MessageFederateManager::getMessage(Endpoint *ept)

{
  bool bVar1;
  long in_RSI;
  _Head_base<0UL,_helics::Message_*,_false> in_RDI;
  optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> message;
  EndpointData *eptDat;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffb8;
  _Head_base<0UL,_helics::Message_*,_false> this;
  
  this._M_head_impl = in_RDI._M_head_impl;
  if (*(long *)(in_RSI + 0x48) != 0) {
    gmlc::containers::
    SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
    ::pop((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
           *)in_RDI._M_head_impl);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                        *)0x2769fe);
    if (bVar1) {
      std::optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>::
      operator*((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                 *)0x276a0e);
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 this._M_head_impl,in_stack_ffffffffffffffb8);
    }
    std::optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>::
    ~optional((optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> *)
              0x276a37);
    if (bVar1) {
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             in_RDI._M_head_impl;
    }
  }
  std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
  unique_ptr<std::default_delete<helics::Message>,void>
            ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this._M_head_impl
             ,in_stack_ffffffffffffffb8);
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageFederateManager::getMessage(const Endpoint& ept)
{
    if (ept.dataReference != nullptr) {
        auto* eptDat = reinterpret_cast<EndpointData*>(ept.dataReference);
        auto message = eptDat->messages.pop();
        if (message) {
            return std::move(*message);
        }
    }
    return nullptr;
}